

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

uint64_t __thiscall mkvmuxer::Chapter::WriteAtom(Chapter *this,IMkvWriter *writer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint64 uVar4;
  uint64 uVar5;
  uint64 uVar6;
  uint64 uVar7;
  uint64_t uVar8;
  undefined4 extraout_var;
  uint64_t uVar9;
  undefined4 extraout_var_00;
  long lVar10;
  long lVar11;
  
  uVar4 = EbmlElementSize(0x5654,this->id_);
  uVar5 = EbmlElementSize(0x73c4,this->uid_);
  uVar6 = EbmlElementSize(0x91,this->start_timecode_);
  uVar7 = EbmlElementSize(0x92,this->end_timecode_);
  uVar4 = uVar7 + uVar6 + uVar5 + uVar4;
  if (0 < this->displays_count_) {
    lVar11 = 0;
    lVar10 = 0;
    do {
      uVar8 = Display::WriteDisplay
                        ((Display *)((long)&this->displays_->title_ + lVar11),(IMkvWriter *)0x0);
      uVar4 = uVar4 + uVar8;
      lVar10 = lVar10 + 1;
      lVar11 = lVar11 + 0x18;
    } while (lVar10 < this->displays_count_);
  }
  uVar5 = EbmlMasterElementSize(0xb6,uVar4);
  uVar8 = uVar5 + uVar4;
  if (writer != (IMkvWriter *)0x0) {
    iVar2 = (*writer->_vptr_IMkvWriter[1])(writer);
    bVar1 = WriteEbmlMasterElement(writer,0xb6,uVar4);
    if ((((bVar1) && (bVar1 = WriteEbmlElement(writer,0x5654,this->id_), bVar1)) &&
        (bVar1 = WriteEbmlElement(writer,0x73c4,this->uid_), bVar1)) &&
       ((bVar1 = WriteEbmlElement(writer,0x91,this->start_timecode_), bVar1 &&
        (bVar1 = WriteEbmlElement(writer,0x92,this->end_timecode_), bVar1)))) {
      if (0 < this->displays_count_) {
        lVar11 = 0;
        lVar10 = 0;
        do {
          uVar9 = Display::WriteDisplay((Display *)((long)&this->displays_->title_ + lVar11),writer)
          ;
          if (uVar9 == 0) goto LAB_0014dd1f;
          lVar10 = lVar10 + 1;
          lVar11 = lVar11 + 0x18;
        } while (lVar10 < this->displays_count_);
      }
      iVar3 = (*writer->_vptr_IMkvWriter[1])(writer);
      uVar9 = 0;
      if (CONCAT44(extraout_var_00,iVar3) - CONCAT44(extraout_var,iVar2) == uVar8) {
        uVar9 = uVar8;
      }
      if (CONCAT44(extraout_var,iVar2) <= CONCAT44(extraout_var_00,iVar3)) {
        uVar8 = uVar9;
      }
    }
    else {
LAB_0014dd1f:
      uVar8 = 0;
    }
  }
  return uVar8;
}

Assistant:

uint64_t Chapter::WriteAtom(IMkvWriter* writer) const {
  uint64_t payload_size =
      EbmlElementSize(libwebm::kMkvChapterStringUID, id_) +
      EbmlElementSize(libwebm::kMkvChapterUID, static_cast<uint64>(uid_)) +
      EbmlElementSize(libwebm::kMkvChapterTimeStart,
                      static_cast<uint64>(start_timecode_)) +
      EbmlElementSize(libwebm::kMkvChapterTimeEnd,
                      static_cast<uint64>(end_timecode_));

  for (int idx = 0; idx < displays_count_; ++idx) {
    const Display& d = displays_[idx];
    payload_size += d.WriteDisplay(NULL);
  }

  const uint64_t atom_size =
      EbmlMasterElementSize(libwebm::kMkvChapterAtom, payload_size) +
      payload_size;

  if (writer == NULL)
    return atom_size;

  const int64_t start = writer->Position();

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvChapterAtom, payload_size))
    return 0;

  if (!WriteEbmlElement(writer, libwebm::kMkvChapterStringUID, id_))
    return 0;

  if (!WriteEbmlElement(writer, libwebm::kMkvChapterUID,
                        static_cast<uint64>(uid_)))
    return 0;

  if (!WriteEbmlElement(writer, libwebm::kMkvChapterTimeStart,
                        static_cast<uint64>(start_timecode_)))
    return 0;

  if (!WriteEbmlElement(writer, libwebm::kMkvChapterTimeEnd,
                        static_cast<uint64>(end_timecode_)))
    return 0;

  for (int idx = 0; idx < displays_count_; ++idx) {
    const Display& d = displays_[idx];

    if (!d.WriteDisplay(writer))
      return 0;
  }

  const int64_t stop = writer->Position();

  if (stop >= start && uint64_t(stop - start) != atom_size)
    return 0;

  return atom_size;
}